

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O1

void __thiscall spv::Instruction::addStringOperand(Instruction *this,char *str)

{
  char cVar1;
  iterator iVar2;
  int iVar3;
  uint *__s;
  uint word;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  iVar3 = 0;
  __s = &local_3c;
  do {
    cVar1 = *str;
    *(char *)__s = cVar1;
    iVar3 = iVar3 + 1;
    if (iVar3 == 4) {
      local_38 = local_3c;
      iVar2._M_current =
           (this->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &this->operands,iVar2,&local_38);
      }
      else {
        *iVar2._M_current = local_3c;
        (this->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar3 = 0;
      __s = &local_3c;
    }
    else {
      __s = (uint *)((long)__s + 1);
    }
    str = str + 1;
  } while (cVar1 != '\0');
  if (0 < iVar3) {
    if (iVar3 < 4) {
      memset(__s,0,(ulong)(3 - iVar3) + 1);
    }
    local_34 = local_3c;
    iVar2._M_current =
         (this->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &this->operands,iVar2,&local_34);
    }
    else {
      *iVar2._M_current = local_3c;
      (this->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  return;
}

Assistant:

void addStringOperand(const char* str)
    {
        unsigned int word;
        char* wordString = (char*)&word;
        char* wordPtr = wordString;
        int charCount = 0;
        char c;
        do {
            c = *(str++);
            *(wordPtr++) = c;
            ++charCount;
            if (charCount == 4) {
                addImmediateOperand(word);
                wordPtr = wordString;
                charCount = 0;
            }
        } while (c != 0);

        // deal with partial last word
        if (charCount > 0) {
            // pad with 0s
            for (; charCount < 4; ++charCount)
                *(wordPtr++) = 0;
            addImmediateOperand(word);
        }
    }